

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::emit_binary_func_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op)

{
  bool bVar1;
  uint32_t result_type_00;
  uint32_t result_id_00;
  bool local_b1;
  bool local_a5;
  string local_98;
  string local_78;
  string local_58;
  bool local_36;
  undefined1 local_35;
  TypeID local_34;
  bool forward;
  bool must_forward;
  SPIRType *pSStack_30;
  SPIRType *type;
  char *op_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  type = (SPIRType *)op;
  op_local._0_4_ = op1;
  op_local._4_4_ = op0;
  op1_local = result_id;
  op0_local = result_type;
  _result_id_local = this;
  TypedID<(diligent_spirv_cross::Types)1>::TypedID(&local_34,result_type);
  pSStack_30 = Compiler::get_type(&this->super_Compiler,local_34);
  local_35 = Compiler::type_is_opaque_value(&this->super_Compiler,pSStack_30);
  local_a5 = true;
  if (!(bool)local_35) {
    bVar1 = should_forward(this,op_local._4_4_);
    local_b1 = false;
    if (bVar1) {
      local_b1 = should_forward(this,(uint32_t)op_local);
    }
    local_a5 = local_b1;
  }
  local_36 = local_a5;
  result_type_00 = op0_local;
  result_id_00 = op1_local;
  to_unpacked_expression_abi_cxx11_(&local_78,this,op_local._4_4_,true);
  to_unpacked_expression_abi_cxx11_(&local_98,this,(uint32_t)op_local,true);
  join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
            (&local_58,(diligent_spirv_cross *)&type,(char **)0xe5b075,(char (*) [2])&local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf64f1c,
             (char (*) [3])&local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf65f2d,
             (char (*) [2])CONCAT44(result_id_00,result_type_00));
  emit_op(this,result_type_00,result_id_00,&local_58,(bool)(local_36 & 1),false);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,op_local._4_4_);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,(uint32_t)op_local);
  return;
}

Assistant:

void CompilerGLSL::emit_binary_func_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                       const char *op)
{
	// Opaque types (e.g. OpTypeSampledImage) must always be forwarded in GLSL
	const auto &type = get_type(result_type);
	bool must_forward = type_is_opaque_value(type);
	bool forward = must_forward || (should_forward(op0) && should_forward(op1));
	emit_op(result_type, result_id, join(op, "(", to_unpacked_expression(op0), ", ", to_unpacked_expression(op1), ")"),
	        forward);
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}